

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Stats::getArrayError(Stats *this,int index)

{
  ResultType *ret;
  reference pvVar1;
  ResultType *pRVar2;
  reference ppBVar3;
  int in_EDX;
  long in_RSI;
  Accumulator *in_RDI;
  uint i;
  RealType v;
  vector<double,_std::allocator<double>_> *value;
  Accumulator *this_00;
  uint local_24;
  
  this_00 = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2fcbd3);
  local_24 = 0;
  while( true ) {
    ret = (ResultType *)(ulong)local_24;
    pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
             operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                         *)(in_RSI + 0x18),(long)in_EDX);
    pRVar2 = (ResultType *)
             std::vector<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>::
             size(&pvVar1->accumulatorArray2d);
    if (pRVar2 <= ret) break;
    pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
             operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                         *)(in_RSI + 0x18),(long)in_EDX);
    ppBVar3 = std::vector<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>::
              operator[](&pvVar1->accumulatorArray2d,(ulong)local_24);
    if (*ppBVar3 != (value_type)0x0) {
      __dynamic_cast(*ppBVar3,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
    }
    Accumulator::get95percentConfidenceInterval(this_00,ret);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)this_00,ret);
    local_24 = local_24 + 1;
  }
  return (vector<double,_std::allocator<double>_> *)in_RDI;
}

Assistant:

std::vector<RealType> Stats::getArrayError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    std::vector<RealType> value;
    RealType v;
    for (unsigned int i = 0; i < data_[index].accumulatorArray2d.size(); ++i) {
      dynamic_cast<Accumulator*>(data_[index].accumulatorArray2d[i])
          ->get95percentConfidenceInterval(v);
      value.push_back(v);
    }
    return value;
  }